

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

bool __thiscall higan::HttpRequest::SetMethod(HttpRequest *this,char *begin,char *end)

{
  HttpRequestMethod HVar1;
  bool bVar2;
  undefined1 local_38 [8];
  string method;
  
  local_38 = (undefined1  [8])&method._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"GET");
  if (bVar2) {
    HVar1 = HTTP_REQUEST_GET;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"POST");
    if (bVar2) {
      HVar1 = HTTP_REQUEST_POST;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"PUT");
      if (bVar2) {
        HVar1 = HTTP_REQUEST_PUT;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"DELETE");
        if (!bVar2) {
          bVar2 = false;
          goto LAB_00106194;
        }
        HVar1 = HTTP_REQUEST_DELETE;
      }
    }
  }
  this->method_ = HVar1;
  bVar2 = true;
LAB_00106194:
  std::__cxx11::string::~string((string *)local_38);
  return bVar2;
}

Assistant:

bool HttpRequest::SetMethod(const char* begin, const char* end)
{
	std::string method(begin, end);

	if (method == "GET")
	{
		method_ = HTTP_REQUEST_GET;
	}
	else if (method == "POST")
	{
		method_ = HTTP_REQUEST_POST;
	}
	else if (method == "PUT")
	{
		method_ = HTTP_REQUEST_PUT;
	}
	else if (method == "DELETE")
	{
		method_ = HTTP_REQUEST_DELETE;
	}
	else
	{
		return false;
	}
	return true;
}